

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FeatureSetDefaults * __thiscall
google::protobuf::DescriptorPool::GetFeatureSetDefaults(DescriptorPool *this)

{
  int iVar1;
  FeatureSetDefaults *pFVar2;
  anon_class_1_0_00000001 *this_00;
  
  pFVar2 = (this->feature_set_defaults_spec_)._M_t.
           super___uniq_ptr_impl<google::protobuf::FeatureSetDefaults,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::FeatureSetDefaults_*,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
           .super__Head_base<0UL,_google::protobuf::FeatureSetDefaults_*,_false>._M_head_impl;
  if ((pFVar2 == (FeatureSetDefaults *)0x0) &&
     (pFVar2 = GetFeatureSetDefaults::cpp_default_spec,
     GetFeatureSetDefaults()::cpp_default_spec == '\0')) {
    this_00 = (anon_class_1_0_00000001 *)&GetFeatureSetDefaults()::cpp_default_spec;
    iVar1 = __cxa_guard_acquire();
    pFVar2 = GetFeatureSetDefaults::cpp_default_spec;
    if (iVar1 != 0) {
      pFVar2 = GetFeatureSetDefaults::anon_class_1_0_00000001::operator()(this_00);
      internal::OnShutdownRun
                (internal::OnShutdownDelete<google::protobuf::FeatureSetDefaults>::
                 anon_class_1_0_00000001::__invoke,pFVar2);
      GetFeatureSetDefaults::cpp_default_spec = pFVar2;
      __cxa_guard_release(&GetFeatureSetDefaults()::cpp_default_spec);
      pFVar2 = GetFeatureSetDefaults::cpp_default_spec;
    }
  }
  return pFVar2;
}

Assistant:

void Fold(std::initializer_list<ExpressionEater>) {}